

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

int __thiscall QFormLayout::heightForWidth(QFormLayout *this,int width)

{
  long lVar1;
  bool bVar2;
  int width_00;
  QFormLayoutPrivate *this_00;
  ulong uVar3;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *dat;
  int targetWidth;
  QFormLayoutPrivate *d;
  int bottomMargin;
  int rightMargin;
  int topMargin;
  int leftMargin;
  int in_stack_000000b4;
  QFormLayoutPrivate *in_stack_000000b8;
  int *in_stack_ffffffffffffffb8;
  int w;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QFormLayoutPrivate *pQVar4;
  undefined4 in_stack_ffffffffffffffd0;
  int local_1c;
  int width_01;
  int iVar5;
  int iVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QFormLayout *)0x4b6ece);
  uVar3 = (**(code **)(*in_RDI + 0xf8))();
  if ((uVar3 & 1) == 0) {
    local_1c = -1;
  }
  else {
    iVar6 = -0x55555556;
    iVar5 = -0x55555556;
    width_01 = -0x55555556;
    QLayout::getContentsMargins
              ((QLayout *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),(int *)this_00,
               (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(int *)in_RDI);
    width_00 = (in_ESI - iVar6) - width_01;
    bVar2 = QFormLayoutPrivate::haveHfwCached(this_00,width_00);
    pQVar4 = this_00;
    if (!bVar2) {
      QFormLayoutPrivate::setupVerticalLayoutData(in_stack_000000b8,in_stack_000000b4);
      w = (int)((ulong)this_00 >> 0x20);
      QFormLayoutPrivate::setupHorizontalLayoutData
                ((QFormLayoutPrivate *)CONCAT44(iVar6,iVar5),width_01);
      QFormLayoutPrivate::recalcHFW
                ((QFormLayoutPrivate *)CONCAT44(width_00,in_stack_ffffffffffffffc0),w);
    }
    if (width_00 == pQVar4->sh_width) {
      local_1c = pQVar4->hfw_sh_height + iVar5 + -0x55555556;
    }
    else {
      local_1c = pQVar4->hfw_height + iVar5 + -0x55555556;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

int QFormLayout::heightForWidth(int width) const
{
    Q_D(const QFormLayout);
    if (!hasHeightForWidth())
        return -1;

    int leftMargin, topMargin, rightMargin, bottomMargin;
    getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    int targetWidth = width - leftMargin - rightMargin;

    if (!d->haveHfwCached(targetWidth)) {
        QFormLayoutPrivate *dat = const_cast<QFormLayoutPrivate *>(d);
        dat->setupVerticalLayoutData(targetWidth);
        dat->setupHorizontalLayoutData(targetWidth);
        dat->recalcHFW(targetWidth);
    }
    if (targetWidth == d->sh_width)
        return d->hfw_sh_height + topMargin + bottomMargin;
    else
        return d->hfw_height + topMargin + bottomMargin;
}